

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O2

void Omega_h::add_implied_isos_tag(Mesh *mesh)

{
  ScopedTimer omega_h_scoped_function_timer;
  Reals metrics;
  ScopedTimer local_9a;
  allocator local_99;
  Write<double> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
             ,&local_99);
  std::operator+(&local_88,&local_48,":");
  std::__cxx11::to_string(&local_28,0x115);
  std::operator+(&local_68,&local_88,&local_28);
  begin_code("add_implied_isos_tag",local_68._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  get_implied_isos((Omega_h *)&local_88,mesh);
  Write<double>::Write(&local_98,(Write<double> *)&local_88);
  std::__cxx11::string::string((string *)&local_68,"metric",(allocator *)&local_48);
  add_metric_tag(mesh,(Reals *)&local_98,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  Write<double>::~Write(&local_98);
  Write<double>::~Write((Write<double> *)&local_88);
  ScopedTimer::~ScopedTimer(&local_9a);
  return;
}

Assistant:

void add_implied_isos_tag(Mesh* mesh) {
  OMEGA_H_TIME_FUNCTION;
  auto metrics = get_implied_isos(mesh);
  add_metric_tag(mesh, metrics, "metric");
}